

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_ldrex(DisasContext_conflict1 *s,arg_LDREX *a,MemOp mop,_Bool acq)

{
  int iVar1;
  int iVar2;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *tcg_ctx_00;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  uint uVar3;
  TCGv_i32 var;
  TCGv_i32 val;
  TCGv_i32 var_00;
  TCGv_i64 val_00;
  TCGv_i64 addr;
  TCGv_i32 hi;
  uintptr_t o;
  TCGv_i32 lo;
  uintptr_t o_1;
  MemOp opc;
  
  if ((a->rn != 0xf) && (iVar1 = a->rt, iVar1 != 0xf)) {
    tcg_ctx = s->uc->tcg_ctx;
    uVar3 = (uint)s->features & 0x8000200;
    if (((uVar3 == 0x8000000) || ((iVar1 != 0xd || (s->thumb == 0)))) &&
       ((mop != MO_64 ||
        ((iVar2 = a->rt2, iVar1 != iVar2 && iVar2 != 0xf &&
         (((uVar3 == 0x8000000 || (iVar2 != 0xd)) || (s->thumb == 0)))))))) {
      var = tcg_temp_local_new_i32(tcg_ctx);
      load_reg_var(s,var,a->rn);
      tcg_gen_addi_i32_aarch64(tcg_ctx,var,var,a->imm);
      iVar1 = a->rt;
      iVar2 = a->rt2;
      tcg_ctx_00 = s->uc->tcg_ctx;
      val = tcg_temp_new_i32(tcg_ctx_00);
      opc = s->be_data | mop | MO_ALIGN;
      s->is_ldex = true;
      if (mop == MO_64) {
        var_00 = tcg_temp_new_i32(tcg_ctx_00);
        val_00 = tcg_temp_new_i64(tcg_ctx_00);
        addr = gen_aa32_addr(s,var,opc);
        tcg_gen_qemu_ld_i64_aarch64(tcg_ctx_00,val_00,addr,(ulong)(s->mmu_idx & 0xf),opc);
        tcg_temp_free_internal_aarch64(tcg_ctx_00,(TCGTemp *)(addr + (long)tcg_ctx_00));
        tcg_gen_mov_i64_aarch64(tcg_ctx_00,tcg_ctx_00->cpu_exclusive_val,val_00);
        hi = var_00;
        lo = val;
        if (s->be_data == MO_BE) {
          hi = val;
          lo = var_00;
        }
        tcg_gen_extr_i64_i32_aarch64(tcg_ctx_00,lo,hi,val_00);
        tcg_temp_free_internal_aarch64(tcg_ctx_00,(TCGTemp *)(val_00 + (long)tcg_ctx_00));
        store_reg(s,iVar2,var_00);
      }
      else {
        gen_aa32_ld_i32(s,val,var,s->mmu_idx & 0xf,opc);
        tcg_gen_extu_i32_i64_aarch64(tcg_ctx_00,tcg_ctx_00->cpu_exclusive_val,val);
      }
      store_reg(s,iVar1,val);
      tcg_gen_extu_i32_i64_aarch64(tcg_ctx_00,tcg_ctx_00->cpu_exclusive_addr,var);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
      if (!acq) {
        return (_Bool)extraout_AL_00;
      }
      tcg_gen_mb_aarch64(tcg_ctx,TCG_BAR_LDAQ|TCG_MO_ALL);
      return (_Bool)extraout_AL_01;
    }
  }
  unallocated_encoding_aarch64(s);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_ldrex(DisasContext *s, arg_LDREX *a, MemOp mop, bool acq)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr;
    /* Some cases stopped being UNPREDICTABLE in v8A (but not v8M) */
    bool v8a = ENABLE_ARCH_8 && !arm_dc_feature(s, ARM_FEATURE_M);

    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rn == 15 || a->rt == 15
        || (!v8a && s->thumb && a->rt == 13)
        || (mop == MO_64
            && (a->rt2 == 15 || a->rt == a->rt2
                || (!v8a && s->thumb && a->rt2 == 13)))) {
        unallocated_encoding(s);
        return true;
    }

    addr = tcg_temp_local_new_i32(tcg_ctx);
    load_reg_var(s, addr, a->rn);
    tcg_gen_addi_i32(tcg_ctx, addr, addr, a->imm);

    gen_load_exclusive(s, a->rt, a->rt2, addr, mop);
    tcg_temp_free_i32(tcg_ctx, addr);

    if (acq) {
        tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_LDAQ);
    }
    return true;
}